

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRunNode::~TestRunNode(TestRunNode *this)

{
  pointer pcVar1;
  
  (this->super_TestRunStats)._vptr_TestRunStats = (_func_int **)&PTR__TestRunNode_00161198;
  std::vector<Catch::TestGroupNode,_std::allocator<Catch::TestGroupNode>_>::~vector(&this->groups);
  (this->super_TestRunStats)._vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_00161148;
  pcVar1 = (this->super_TestRunStats).runInfo.name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TestRunStats).runInfo.name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TestRunNode::~TestRunNode() {}